

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

array * cs::parse_cmd_args(int argc,char **argv)

{
  int in_ESI;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  size_t i;
  array arg;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this;
  char **in_stack_ffffffffffffff88;
  undefined8 local_70;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffc0;
  
  this = in_RDI;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x52f074);
  for (local_70 = 0; local_70 < (ulong)(long)in_ESI; local_70 = local_70 + 1) {
    cs_impl::any::make_constant<std::__cxx11::string,char*&>(in_stack_ffffffffffffff88);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
              (this,(any *)in_RDI);
    cs_impl::any::~any((any *)0x52f0c7);
  }
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque(this,in_RDI);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_ffffffffffffffc0);
  return this;
}

Assistant:

array parse_cmd_args(int argc, char *argv[])
	{
		cs::array arg;
		for (std::size_t i = 0; i < argc; ++i)
			arg.emplace_back(cs::var::make_constant<cs::string>(argv[i]));
		return std::move(arg);
	}